

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O3

bool __thiscall
unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::
try_left_most_traversal
          (iterator *this,olc_node_ptr node,read_critical_section *parent_critical_section)

{
  atomic<long> *paVar1;
  long lVar2;
  optimistic_lock *poVar3;
  __int_type_conflict _Var4;
  __int_type_conflict _Var5;
  bool bVar6;
  node_type type;
  node_ptr local_68;
  iter_result t;
  undefined1 local_40 [8];
  read_critical_section node_critical_section;
  
  bVar6 = optimistic_lock::check
                    (parent_critical_section->lock,
                     (version_type)(parent_critical_section->version).version);
  if (!bVar6) {
    parent_critical_section->lock = (optimistic_lock *)0x0;
    return false;
  }
  if (node.tagged_ptr != 0) {
    do {
      optimistic_lock::try_read_lock((optimistic_lock *)local_40);
      if (local_40 == (undefined1  [8])0x0) {
LAB_00189d54:
        bVar6 = false;
LAB_00189d19:
        optimistic_lock::read_critical_section::~read_critical_section
                  ((read_critical_section *)local_40);
        return bVar6;
      }
      poVar3 = parent_critical_section->lock;
      _Var4 = (parent_critical_section->version).version;
      if ((poVar3->read_lock_count).super___atomic_base<long>._M_i < 1) {
LAB_00189d73:
        __assert_fail("read_lock_count.load(std::memory_order_acquire) > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                      ,0x2f6,"bool unodb::optimistic_lock::check(version_type) const");
      }
      _Var5 = (poVar3->version).version.super___atomic_base<unsigned_long>._M_i;
      LOCK();
      paVar1 = &poVar3->read_lock_count;
      lVar2 = (paVar1->super___atomic_base<long>)._M_i;
      (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
      UNLOCK();
      if (_Var4 != _Var5) {
        if (lVar2 < 1) goto LAB_00189d92;
        parent_critical_section->lock = (optimistic_lock *)0x0;
        goto LAB_00189d54;
      }
      if (lVar2 < 1) {
LAB_00189d92:
        __assert_fail("old_value > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                      ,0x343,"void unodb::optimistic_lock::dec_read_lock_count() const");
      }
      parent_critical_section->lock = (optimistic_lock *)0x0;
      type = (node_type)node.tagged_ptr & (I256|I48);
      if ((node.tagged_ptr & 7) == 0) {
        t.node.tagged_ptr._0_2_ = 0xffff;
        t.key_byte = 0;
        t.child_index = '\0';
        t._10_6_ = 0;
        t.prefix = (key_prefix_snapshot)node_critical_section.lock;
        local_68.tagged_ptr = node.tagged_ptr;
        std::
        deque<unodb::olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>::iterator::stack_entry,std::allocator<unodb::olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>::iterator::stack_entry>>
        ::
        emplace_back<unodb::olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>::iterator::stack_entry>
                  ((deque<unodb::olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>::iterator::stack_entry,std::allocator<unodb::olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>::iterator::stack_entry>>
                    *)&this->stack_,(stack_entry *)&stack0xffffffffffffff98);
        if ((((atomic<long> *)((long)local_40 + 8))->super___atomic_base<long>)._M_i < 1)
        goto LAB_00189d73;
        poVar3 = *(optimistic_lock **)local_40;
        LOCK();
        paVar1 = (atomic<long> *)((long)local_40 + 8);
        lVar2 = (paVar1->super___atomic_base<long>)._M_i;
        (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
        UNLOCK();
        bVar6 = node_critical_section.lock == poVar3;
        if (bVar6) {
          if (lVar2 < 1) goto LAB_00189d92;
        }
        else {
          olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>::iterator::
          try_left_most_traversal((iterator *)(ulong)(0 < lVar2));
        }
        local_40 = (undefined1  [8])0x0;
        goto LAB_00189d19;
      }
      detail::
      basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
      ::begin((iter_result *)&stack0xffffffffffffff98,
              (basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
               *)(node.tagged_ptr & 0xfffffffffffffff8),type);
      bVar6 = optimistic_lock::check
                        ((optimistic_lock *)local_40,(version_type)node_critical_section.lock);
      if (!bVar6) {
LAB_00189d33:
        local_40 = (undefined1  [8])0x0;
LAB_00189d3b:
        optimistic_lock::read_critical_section::~read_critical_section
                  ((read_critical_section *)local_40);
        return false;
      }
      bVar6 = try_push(this,(iter_result *)&stack0xffffffffffffff98,
                       (read_critical_section *)local_40);
      if (!bVar6) goto LAB_00189d3b;
      node.tagged_ptr =
           (uintptr_t)
           detail::
           basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
           ::get_child((basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                        *)(node.tagged_ptr & 0xfffffffffffffff8),type,t.node.tagged_ptr._1_1_);
      bVar6 = optimistic_lock::check
                        ((optimistic_lock *)local_40,(version_type)node_critical_section.lock);
      if (!bVar6) goto LAB_00189d33;
      parent_critical_section->lock = (optimistic_lock *)local_40;
      local_40 = (undefined1  [8])0x0;
      (parent_critical_section->version).version = (version_tag_type)node_critical_section.lock;
      optimistic_lock::read_critical_section::~read_critical_section
                ((read_critical_section *)local_40);
    } while (node.tagged_ptr != 0);
  }
  __assert_fail("node != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                ,0x9fd,
                "bool unodb::olc_db<unsigned long, std::span<const std::byte>>::iterator::try_left_most_traversal(detail::olc_node_ptr, optimistic_lock::read_critical_section &) [Key = unsigned long, Value = std::span<const std::byte>]"
               );
}

Assistant:

bool olc_db<Key, Value>::iterator::try_left_most_traversal(
    detail::olc_node_ptr node,
    optimistic_lock::read_critical_section& parent_critical_section) {
  // A check() is required before acting on [node] by taking the lock.
  if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.check())) {
    // LCOV_EXCL_START
    spin_wait_loop_body();
    return {};
    // LCOV_EXCL_STOP
  }
  while (true) {
    UNODB_DETAIL_ASSERT(node != nullptr);
    // Lock version chaining (node and parent)
    auto node_critical_section = node_ptr_lock(node).try_read_lock();
    if (UNODB_DETAIL_UNLIKELY(node_critical_section.must_restart()))
      return false;  // LCOV_EXCL_LINE
    if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.try_read_unlock()))
      return false;  // LCOV_EXCL_LINE
    const auto node_type = node.type();
    if (node_type == node_type::LEAF) {
      if (UNODB_DETAIL_UNLIKELY(!try_push_leaf(node, node_critical_section)))
        return false;  // LCOV_EXCL_LINE
      return UNODB_DETAIL_LIKELY(node_critical_section.try_read_unlock());
    }
    // recursive descent.
    auto* const inode{node.ptr<inode_type*>()};
    const auto t =
        inode->begin(node_type);  // first chold of current internal node
    if (UNODB_DETAIL_UNLIKELY(!node_critical_section.check()))
      return false;  // LCOV_EXCL_LINE
    if (UNODB_DETAIL_UNLIKELY(!try_push(t, node_critical_section)))
      return false;                                     // LCOV_EXCL_LINE
    node = inode->get_child(node_type, t.child_index);  // get child
    if (UNODB_DETAIL_UNLIKELY(!node_critical_section.check()))  // before using
      return false;  // LCOV_EXCL_LINE
    // Move RCS (will check invariant at top of loop)
    parent_critical_section = std::move(node_critical_section);
  }
  UNODB_DETAIL_CANNOT_HAPPEN();
}